

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O3

void __thiscall
QtPrivate::BindingStatusOrList::removeObject(BindingStatusOrList *this,QObject *object)

{
  ulong uVar1;
  __normal_iterator<QObject_**,_std::vector<QObject_*,_std::allocator<QObject_*>_>_> _Var2;
  undefined8 *puVar3;
  long in_FS_OFFSET;
  QObject *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (this->data).super___atomic_base<unsigned_long_long>._M_i;
  puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffe);
  local_18 = object;
  if (puVar3 != (undefined8 *)0x0 && (uVar1 & 1) != 0) {
    _Var2 = std::
            __remove_if<__gnu_cxx::__normal_iterator<QObject**,std::vector<QObject*,std::allocator<QObject*>>>,__gnu_cxx::__ops::_Iter_equals_val<QObject*const>>
                      ((QObject **)*puVar3,(QObject **)puVar3[1],&local_18);
    if (_Var2._M_current != (QObject **)puVar3[1]) {
      puVar3[1] = _Var2._M_current;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QtPrivate::BindingStatusOrList::removeObject(QObject *object)
{
    List *objectList = list();
    if (!objectList)
        return;
    auto it = std::remove(objectList->begin(), objectList->end(), object);
    objectList->erase(it, objectList->end());
}